

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O1

stack_st_OPENSSL_STRING * get_email(X509_NAME *name,GENERAL_NAMES *gens)

{
  int lastpos;
  int iVar1;
  uint uVar2;
  X509_NAME_ENTRY *ne;
  ASN1_STRING *email;
  size_t sVar3;
  int *piVar4;
  size_t sVar5;
  bool bVar6;
  stack_st_OPENSSL_STRING *ret;
  stack_st_OPENSSL_STRING *local_30;
  
  local_30 = (stack_st_OPENSSL_STRING *)0x0;
  lastpos = -1;
  while (lastpos = X509_NAME_get_index_by_NID((X509_NAME *)name,0x30,lastpos), -1 < lastpos) {
    ne = X509_NAME_get_entry((X509_NAME *)name,lastpos);
    email = X509_NAME_ENTRY_get_data(ne);
    iVar1 = append_ia5(&local_30,(ASN1_IA5STRING *)email);
    if (iVar1 == 0) {
      return (stack_st_OPENSSL_STRING *)0x0;
    }
  }
  sVar3 = OPENSSL_sk_num((OPENSSL_STACK *)gens);
  bVar6 = sVar3 != 0;
  if (bVar6) {
    sVar3 = 0;
    do {
      piVar4 = (int *)OPENSSL_sk_value((OPENSSL_STACK *)gens,sVar3);
      uVar2 = 6;
      if (*piVar4 == 1) {
        uVar2 = append_ia5(&local_30,*(ASN1_IA5STRING **)(piVar4 + 2));
        uVar2 = uVar2 ^ 1;
      }
      if ((uVar2 != 6) && (uVar2 != 0)) break;
      sVar3 = sVar3 + 1;
      sVar5 = OPENSSL_sk_num((OPENSSL_STACK *)gens);
      bVar6 = sVar3 < sVar5;
    } while (bVar6);
  }
  if (bVar6) {
    local_30 = (stack_st_OPENSSL_STRING *)0x0;
  }
  return local_30;
}

Assistant:

static STACK_OF(OPENSSL_STRING) *get_email(const X509_NAME *name,
                                           const GENERAL_NAMES *gens) {
  STACK_OF(OPENSSL_STRING) *ret = NULL;
  // Now add any email address(es) to STACK
  int i = -1;
  // First supplied X509_NAME
  while ((i = X509_NAME_get_index_by_NID(name, NID_pkcs9_emailAddress, i)) >=
         0) {
    const X509_NAME_ENTRY *ne = X509_NAME_get_entry(name, i);
    const ASN1_IA5STRING *email = X509_NAME_ENTRY_get_data(ne);
    if (!append_ia5(&ret, email)) {
      return NULL;
    }
  }
  for (size_t j = 0; j < sk_GENERAL_NAME_num(gens); j++) {
    const GENERAL_NAME *gen = sk_GENERAL_NAME_value(gens, j);
    if (gen->type != GEN_EMAIL) {
      continue;
    }
    if (!append_ia5(&ret, gen->d.ia5)) {
      return NULL;
    }
  }
  return ret;
}